

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTest<(anonymous_namespace)::ARTIteratorTest,_testing::internal::TemplateSel<(anonymous_namespace)::ARTIteratorTest_C0003_Test>,_testing::internal::Types<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  ulong *puVar1;
  pointer pcVar2;
  uint *puVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  TestFactoryBase *pTVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  size_t sVar11;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *extraout_RDX_03;
  type_info *extraout_RDX_04;
  type_info *ptVar12;
  uint *name;
  undefined4 in_register_00000084;
  type_info *ptVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  char *pcVar15;
  uint *puVar16;
  long lVar17;
  char *pcVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  CodeLocation local_398;
  uint *local_370;
  type_info *local_368;
  undefined8 local_360;
  undefined8 uStack_358;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  CodeLocation local_2d0;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  uint *local_268;
  type_info *local_260;
  uint local_258;
  undefined2 uStack_254;
  undefined2 uStack_252;
  undefined8 uStack_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  type_info *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  type_info *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_208;
  type_info *local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  int local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  type_info *local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  CodeLocation local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  int local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  CodeLocation *local_130;
  char *local_128;
  string local_120;
  CodeLocation local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  int local_b8;
  string local_b0;
  int local_90;
  CodeLocation local_88;
  GTestLog local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_130 = code_location;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"","",test_names,CONCAT44(in_register_00000084,index));
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"");
  local_100.file._M_dataplus._M_p = (pointer)&local_100.file.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_100.file.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_100.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_100.file.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_100.file._M_dataplus._M_p = (pointer)paVar10;
  }
  local_100.file._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_100.file,"ARTIteratorTest");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_d8.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)paVar10;
  }
  local_d8._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d8,"/");
  local_88.file._M_dataplus._M_p = (pointer)&local_88.file.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_88.file.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_88.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_88.file.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_88.file._M_dataplus._M_p = (pointer)paVar10;
  }
  local_88.file._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (local_130->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_88.file,*(char **)(pcVar2 + 0x20),*(size_type *)(pcVar2 + 0x28));
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_2f0.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_2f0.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_2f0._M_dataplus._M_p = (pointer)paVar10;
  }
  local_2f0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_1c0 = &local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"C0003","");
  ptVar12 = extraout_RDX;
  paVar10 = local_1c0;
  if (local_1b8 != (type_info *)0x0) {
    ptVar13 = local_1b8 + (long)local_1c0;
    do {
      paVar19 = local_1c0;
      iVar7 = isspace((uint)(byte)ptVar13[-1]);
      ptVar12 = extraout_RDX_00;
      paVar10 = paVar19;
      if (iVar7 == 0) break;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ptVar13 + -1);
      lVar17 = (long)paVar14 - (long)paVar19;
      if ((local_1b8 != (type_info *)(lVar17 + 1)) &&
         (sVar11 = (long)local_1b8 - (lVar17 + 1), sVar11 != 0)) {
        ptVar12 = (type_info *)(paVar19->_M_local_buf + lVar17);
        if (sVar11 == 1) {
          *ptVar12 = ptVar12[1];
        }
        else {
          memmove(ptVar12,(type_info *)(paVar19->_M_local_buf + lVar17 + 1),sVar11);
        }
      }
      ptVar12 = local_1b8 + -1;
      ((type_info *)(local_1c0->_M_local_buf + -1))[(long)local_1b8] = (type_info)0x0;
      ptVar13 = (type_info *)(local_1c0->_M_local_buf + lVar17);
      paVar10 = local_1c0;
      local_1b8 = ptVar12;
    } while (paVar14 != paVar19);
  }
  local_1c0 = &local_1b0;
  if (paVar10 == local_1c0) {
    local_1a0.file.field_2._8_8_ = local_1b0._8_8_;
    paVar10 = &local_1a0.file.field_2;
  }
  local_1a0.file.field_2._M_allocated_capacity._1_7_ = local_1b0._M_allocated_capacity._1_7_;
  local_1a0.file.field_2._M_local_buf[0] = local_1b0._M_local_buf[0];
  local_1a0.file._M_string_length = (size_type)local_1b8;
  local_1b8 = (type_info *)0x0;
  local_1b0._M_local_buf[0] = '\0';
  local_1a0.file._M_dataplus._M_p = (pointer)paVar10;
  GetTypeName_abi_cxx11_
            (&local_b0,
             (internal *)
             &unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
              typeinfo,ptVar12);
  local_128 = local_b0._M_dataplus._M_p;
  local_398.file._M_dataplus._M_p = (pointer)&local_398.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_398,*(long *)prefix,*(long *)(prefix + 8) + *(long *)prefix);
  iVar7 = *(int *)(prefix + 0x20);
  pcVar18 = *(char **)prefix;
  local_398.line = iVar7;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_2d0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (pcVar18 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar18,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_2d0);
  }
  pcVar18 = *(char **)prefix;
  iVar7 = *(int *)(prefix + 0x20);
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_2d0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (pcVar18 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(pcVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar18,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_2d0);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00252398;
  MakeAndRegisterTestInfo
            (&local_2f0,paVar10->_M_local_buf,local_128,(char *)0x0,&local_398,
             &TypeIdHelper<(anonymous_namespace)::ARTIteratorTest<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.file._M_dataplus._M_p != &local_398.file.field_2) {
    operator_delete(local_398.file._M_dataplus._M_p,local_398.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.file._M_dataplus._M_p != &local_1a0.file.field_2) {
    operator_delete(local_1a0.file._M_dataplus._M_p,local_1a0.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,
                    CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.file._M_dataplus._M_p != &local_88.file.field_2) {
    operator_delete(local_88.file._M_dataplus._M_p,local_88.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.file._M_dataplus._M_p != &local_100.file.field_2) {
    operator_delete(local_100.file._M_dataplus._M_p,local_100.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_1e8 = &local_1d8;
  puVar1 = (ulong *)(prefix + 0x10);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)prefix ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1) {
    local_1d8._M_allocated_capacity = *puVar1;
    local_1d8._8_8_ = *(undefined8 *)(prefix + 0x18);
  }
  else {
    local_1d8._M_allocated_capacity = *puVar1;
    local_1e8 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)prefix;
  }
  local_1e0 = *(size_type *)(prefix + 8);
  *(ulong **)prefix = puVar1;
  prefix[8] = '\0';
  prefix[9] = '\0';
  prefix[10] = '\0';
  prefix[0xb] = '\0';
  prefix[0xc] = '\0';
  prefix[0xd] = '\0';
  prefix[0xe] = '\0';
  prefix[0xf] = '\0';
  prefix[0x10] = '\0';
  local_1c8 = *(int *)(prefix + 0x20);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"");
  local_100.file._M_dataplus._M_p = (pointer)&local_100.file.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_100.file.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_100.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_100.file.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_100.file._M_dataplus._M_p = (pointer)paVar10;
  }
  local_100.file._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_100.file,"ARTIteratorTest");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_d8.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)paVar10;
  }
  local_d8._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d8,"/");
  local_88.file._M_dataplus._M_p = (pointer)&local_88.file.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_88.file.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_88.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_88.file.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_88.file._M_dataplus._M_p = (pointer)paVar10;
  }
  local_88.file._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (local_130->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_88.file,*(char **)(pcVar2 + 0x40),*(size_type *)(pcVar2 + 0x48));
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_310.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_310.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_310.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_310._M_dataplus._M_p = (pointer)paVar10;
  }
  local_310._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_208 = &local_1f8;
  local_1f8._M_allocated_capacity._0_4_ = 0x30303043;
  local_1f8._M_allocated_capacity._4_2_ = 0x33;
  local_200 = (type_info *)0x5;
  pcVar18 = local_1f8._M_local_buf + 5;
  do {
    paVar10 = local_208;
    iVar7 = isspace((uint)(byte)pcVar18[-1]);
    ptVar12 = extraout_RDX_01;
    paVar19 = paVar10;
    if (iVar7 == 0) break;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pcVar18 + -1);
    lVar17 = (long)paVar14 - (long)paVar10;
    if ((local_200 != (type_info *)(lVar17 + 1)) &&
       (sVar11 = (long)local_200 - (lVar17 + 1), sVar11 != 0)) {
      pcVar18 = paVar10->_M_local_buf + lVar17;
      if (sVar11 == 1) {
        *pcVar18 = pcVar18[1];
      }
      else {
        memmove(pcVar18,paVar10->_M_local_buf + lVar17 + 1,sVar11);
      }
    }
    ptVar13 = local_200;
    ptVar12 = local_200 + -1;
    local_200 = ptVar12;
    (local_208->_M_local_buf + -1)[(long)ptVar13] = '\0';
    pcVar18 = local_208->_M_local_buf + lVar17;
    paVar19 = local_208;
  } while (paVar14 != paVar10);
  if (paVar19 == &local_1f8) {
    local_1a0.file.field_2._8_8_ = local_1f8._8_8_;
    paVar19 = &local_1a0.file.field_2;
  }
  local_1a0.file.field_2._M_allocated_capacity._4_2_ = local_1f8._M_allocated_capacity._4_2_;
  local_1a0.file.field_2._M_allocated_capacity._0_4_ = local_1f8._M_allocated_capacity._0_4_;
  local_1a0.file.field_2._M_allocated_capacity._6_2_ = local_1f8._M_allocated_capacity._6_2_;
  local_1a0.file._M_string_length = (size_type)local_200;
  local_200 = (type_info *)0x0;
  local_1f8._M_allocated_capacity._0_4_ = local_1f8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_208 = &local_1f8;
  local_1a0.file._M_dataplus._M_p = (pointer)paVar19;
  GetTypeName_abi_cxx11_
            (&local_b0,
             (internal *)
             &unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
              typeinfo,ptVar12);
  local_128 = local_b0._M_dataplus._M_p;
  local_2d0.file._M_dataplus._M_p = (pointer)&local_2d0.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,local_1e8,local_1e0 + (long)local_1e8);
  iVar7 = local_1c8;
  paVar10 = local_1e8;
  local_2d0.line = local_1c8;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_178,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (paVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(paVar10->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar10->_M_local_buf,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_178);
  }
  iVar7 = local_1c8;
  paVar10 = local_1e8;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_178,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (paVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(paVar10->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar10->_M_local_buf,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_178);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00252430;
  MakeAndRegisterTestInfo
            (&local_310,paVar19->_M_local_buf,local_128,(char *)0x0,&local_2d0,
             &TypeIdHelper<(anonymous_namespace)::ARTIteratorTest<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.file._M_dataplus._M_p != &local_2d0.file.field_2) {
    operator_delete(local_2d0.file._M_dataplus._M_p,local_2d0.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.file._M_dataplus._M_p != &local_1a0.file.field_2) {
    operator_delete(local_1a0.file._M_dataplus._M_p,local_1a0.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,
                    CONCAT26(local_1f8._M_allocated_capacity._6_2_,
                             CONCAT24(local_1f8._M_allocated_capacity._4_2_,
                                      local_1f8._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.file._M_dataplus._M_p != &local_88.file.field_2) {
    operator_delete(local_88.file._M_dataplus._M_p,local_88.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.file._M_dataplus._M_p != &local_100.file.field_2) {
    operator_delete(local_100.file._M_dataplus._M_p,local_100.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_178 = &local_168;
  if (local_1e8 == &local_1d8) {
    local_168._8_8_ = local_1d8._8_8_;
  }
  else {
    local_178 = local_1e8;
  }
  local_168._M_allocated_capacity = local_1d8._M_allocated_capacity;
  local_170 = local_1e0;
  local_1e0 = 0;
  local_1d8._M_allocated_capacity = local_1d8._M_allocated_capacity & 0xffffffffffffff00;
  local_158 = local_1c8;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1e8 = &local_1d8;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"");
  local_100.file._M_dataplus._M_p = (pointer)&local_100.file.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_100.file.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_100.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_100.file.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_100.file._M_dataplus._M_p = (pointer)paVar10;
  }
  local_100.file._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_100.file,"ARTIteratorTest");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_d8.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)paVar10;
  }
  local_d8._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d8,"/");
  local_88.file._M_dataplus._M_p = (pointer)&local_88.file.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_88.file.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_88.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_88.file.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_88.file._M_dataplus._M_p = (pointer)paVar10;
  }
  local_88.file._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (local_130->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_88.file,*(char **)(pcVar2 + 0x60),*(size_type *)(pcVar2 + 0x68));
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_330.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_330.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_330.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_330._M_dataplus._M_p = (pointer)paVar10;
  }
  local_330._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_228 = &local_218;
  local_218._M_allocated_capacity._0_4_ = 0x30303043;
  local_218._M_allocated_capacity._4_2_ = 0x33;
  local_220 = (type_info *)0x5;
  pcVar18 = local_218._M_local_buf + 5;
  do {
    paVar10 = local_228;
    iVar7 = isspace((uint)(byte)pcVar18[-1]);
    ptVar12 = extraout_RDX_02;
    paVar19 = paVar10;
    if (iVar7 == 0) break;
    pcVar15 = pcVar18 + -1;
    lVar17 = (long)pcVar15 - (long)paVar10;
    if ((local_220 != (type_info *)(lVar17 + 1)) &&
       (sVar11 = (long)local_220 - (lVar17 + 1), sVar11 != 0)) {
      pcVar18 = paVar10->_M_local_buf + lVar17;
      if (sVar11 == 1) {
        *pcVar18 = pcVar18[1];
      }
      else {
        memmove(pcVar18,paVar10->_M_local_buf + lVar17 + 1,sVar11);
      }
    }
    ptVar13 = local_220;
    ptVar12 = local_220 + -1;
    local_220 = ptVar12;
    (local_228->_M_local_buf + -1)[(long)ptVar13] = '\0';
    pcVar18 = local_228->_M_local_buf + lVar17;
    paVar19 = local_228;
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar15 != paVar10);
  if (paVar19 == &local_218) {
    local_b0.field_2._8_8_ = local_218._8_8_;
    paVar19 = &local_b0.field_2;
  }
  local_b0.field_2._M_allocated_capacity._4_2_ = local_218._M_allocated_capacity._4_2_;
  local_b0.field_2._M_allocated_capacity._0_4_ = local_218._M_allocated_capacity._0_4_;
  local_b0.field_2._M_allocated_capacity._6_2_ = local_218._M_allocated_capacity._6_2_;
  local_b0._M_string_length = (size_type)local_220;
  local_220 = (type_info *)0x0;
  local_218._M_allocated_capacity._0_4_ = local_218._M_allocated_capacity._0_4_ & 0xffffff00;
  local_228 = &local_218;
  local_b0._M_dataplus._M_p = (pointer)paVar19;
  GetTypeName_abi_cxx11_
            (&local_120,
             (internal *)
             &unodb::
              db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::typeinfo,ptVar12);
  local_128 = local_120._M_dataplus._M_p;
  local_1a0.file._M_dataplus._M_p = (pointer)&local_1a0.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,local_178,local_170 + (long)local_178);
  iVar7 = local_158;
  paVar10 = local_178;
  local_1a0.line = local_158;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_150,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (paVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(paVar10->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar10->_M_local_buf,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_150);
  }
  iVar7 = local_158;
  paVar10 = local_178;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_150,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (paVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(paVar10->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar10->_M_local_buf,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_150);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002524c8;
  MakeAndRegisterTestInfo
            (&local_330,paVar19->_M_local_buf,local_128,(char *)0x0,&local_1a0,
             &TypeIdHelper<(anonymous_namespace)::ARTIteratorTest<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.file._M_dataplus._M_p != &local_1a0.file.field_2) {
    operator_delete(local_1a0.file._M_dataplus._M_p,local_1a0.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,
                    CONCAT26(local_218._M_allocated_capacity._6_2_,
                             CONCAT24(local_218._M_allocated_capacity._4_2_,
                                      local_218._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.file._M_dataplus._M_p != &local_88.file.field_2) {
    operator_delete(local_88.file._M_dataplus._M_p,local_88.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.file._M_dataplus._M_p != &local_100.file.field_2) {
    operator_delete(local_100.file._M_dataplus._M_p,local_100.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  if (local_178 == &local_168) {
    local_b0.field_2._8_8_ = local_168._8_8_;
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)local_178;
  }
  local_b0.field_2._M_allocated_capacity = local_168._M_allocated_capacity;
  local_b0._M_string_length = local_170;
  local_170 = 0;
  local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffffffffff00;
  local_90 = local_158;
  local_120._M_string_length = 0;
  local_120.field_2._M_allocated_capacity =
       local_120.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_178 = &local_168;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_120,"");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_58.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_58._M_dataplus._M_p = (pointer)paVar10;
  }
  local_58._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"ARTIteratorTest");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_d8.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)paVar10;
  }
  local_d8._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_d8,"/");
  local_88.file._M_dataplus._M_p = (pointer)&local_88.file.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_88.file.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_88.file.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_88.file.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_88.file._M_dataplus._M_p = (pointer)paVar10;
  }
  local_88.file._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (local_130->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_88.file,*(char **)(pcVar2 + 0x80),*(size_type *)(pcVar2 + 0x88));
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_350.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_350.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_350.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_350._M_dataplus._M_p = (pointer)paVar10;
  }
  local_350._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_248 = &local_238;
  local_238._M_allocated_capacity._0_4_ = 0x30303043;
  local_238._M_allocated_capacity._4_2_ = 0x33;
  local_240 = (type_info *)0x5;
  pcVar18 = local_238._M_local_buf + 5;
  do {
    paVar10 = local_248;
    iVar7 = isspace((uint)(byte)pcVar18[-1]);
    ptVar12 = extraout_RDX_03;
    paVar19 = paVar10;
    if (iVar7 == 0) break;
    pcVar15 = pcVar18 + -1;
    lVar17 = (long)pcVar15 - (long)paVar10;
    if ((local_240 != (type_info *)(lVar17 + 1)) &&
       (sVar11 = (long)local_240 - (lVar17 + 1), sVar11 != 0)) {
      pcVar18 = paVar10->_M_local_buf + lVar17;
      if (sVar11 == 1) {
        *pcVar18 = pcVar18[1];
      }
      else {
        memmove(pcVar18,paVar10->_M_local_buf + lVar17 + 1,sVar11);
      }
    }
    ptVar13 = local_240;
    ptVar12 = local_240 + -1;
    local_240 = ptVar12;
    (local_248->_M_local_buf + -1)[(long)ptVar13] = '\0';
    pcVar18 = local_248->_M_local_buf + lVar17;
    paVar19 = local_248;
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar15 != paVar10);
  if (paVar19 == &local_238) {
    local_150.field_2._8_8_ = local_238._8_8_;
    paVar19 = &local_150.field_2;
  }
  local_150.field_2._M_allocated_capacity._4_2_ = local_238._M_allocated_capacity._4_2_;
  local_150.field_2._M_allocated_capacity._0_4_ = local_238._M_allocated_capacity._0_4_;
  local_150.field_2._M_allocated_capacity._6_2_ = local_238._M_allocated_capacity._6_2_;
  local_150._M_string_length = (size_type)local_240;
  local_240 = (type_info *)0x0;
  local_238._M_allocated_capacity._0_4_ = local_238._M_allocated_capacity._0_4_ & 0xffffff00;
  local_248 = &local_238;
  local_150._M_dataplus._M_p = (pointer)paVar19;
  GetTypeName_abi_cxx11_
            (&local_2a8,
             (internal *)
             &unodb::
              mutex_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::typeinfo,ptVar12);
  local_128 = local_2a8._M_dataplus._M_p;
  local_100.file._M_dataplus._M_p = (pointer)&local_100.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  iVar7 = local_90;
  _Var5._M_p = local_b0._M_dataplus._M_p;
  local_100.line = local_90;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_288,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(_Var5._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,_Var5._M_p,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_288);
  }
  iVar7 = local_90;
  _Var5._M_p = local_b0._M_dataplus._M_p;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_288,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(_Var5._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,_Var5._M_p,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_288);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00252560;
  MakeAndRegisterTestInfo
            (&local_350,paVar19->_M_local_buf,local_128,(char *)0x0,&local_100,
             &TypeIdHelper<(anonymous_namespace)::ARTIteratorTest<unodb::mutex_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.file._M_dataplus._M_p != &local_100.file.field_2) {
    operator_delete(local_100.file._M_dataplus._M_p,local_100.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,
                    CONCAT26(local_238._M_allocated_capacity._6_2_,
                             CONCAT24(local_238._M_allocated_capacity._4_2_,
                                      local_238._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.file._M_dataplus._M_p != &local_88.file.field_2) {
    operator_delete(local_88.file._M_dataplus._M_p,local_88.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
    local_58.field_2._8_8_ = local_b0.field_2._8_8_;
  }
  else {
    local_58._M_dataplus._M_p = local_b0._M_dataplus._M_p;
  }
  local_58.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
  local_58._M_string_length = local_b0._M_string_length;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_allocated_capacity =
       local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_38 = local_90;
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  local_3b8._M_string_length = 0;
  local_3b8.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_3b8,"");
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_288.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_288.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_288.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_288._M_dataplus._M_p = (pointer)paVar10;
  }
  local_288._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_288,"ARTIteratorTest");
  local_2a8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p == paVar10) {
    local_2a8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  }
  else {
    local_2a8.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2a8._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2a8,"/");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_150.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_150.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_150.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_150._M_dataplus._M_p = (pointer)paVar10;
  }
  local_150._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar2 = (local_130->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_150,*(char **)(pcVar2 + 0xa0),*(size_type *)(pcVar2 + 0xa8));
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar19 = &pbVar8->field_2;
  if (paVar10 == paVar19) {
    local_120.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
    local_120.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_120._M_dataplus._M_p = (pointer)paVar10;
    local_120.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
  }
  local_120._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar19;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_258 = 0x30303043;
  uStack_254 = 0x33;
  local_260 = (type_info *)0x5;
  pcVar18 = (char *)((long)&uStack_254 + 1);
  local_268 = &local_258;
  do {
    puVar3 = local_268;
    iVar7 = isspace((uint)(byte)pcVar18[-1]);
    ptVar12 = extraout_RDX_04;
    name = puVar3;
    if (iVar7 == 0) break;
    puVar16 = (uint *)(pcVar18 + -1);
    lVar17 = (long)puVar16 - (long)puVar3;
    if ((local_260 != (type_info *)(lVar17 + 1)) &&
       (sVar11 = (long)local_260 - (lVar17 + 1), sVar11 != 0)) {
      pcVar18 = (char *)((long)puVar3 + lVar17);
      if (sVar11 == 1) {
        *pcVar18 = pcVar18[1];
      }
      else {
        memmove(pcVar18,(char *)((long)puVar3 + lVar17 + 1),sVar11);
      }
    }
    ptVar12 = local_260 + -1;
    ((char *)((long)local_268 + -1))[(long)local_260] = '\0';
    pcVar18 = (char *)((long)local_268 + lVar17);
    name = local_268;
    local_260 = ptVar12;
  } while (puVar16 != puVar3);
  if (name == &local_258) {
    uStack_358 = uStack_250;
    name = (uint *)&local_360;
  }
  local_360 = CONCAT26(uStack_252,CONCAT24(uStack_254,local_258));
  local_368 = local_260;
  local_260 = (type_info *)0x0;
  local_258 = local_258 & 0xffffff00;
  local_370 = name;
  local_268 = &local_258;
  GetTypeName_abi_cxx11_
            (&local_3d8,
             (internal *)
             &unodb::
              olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::typeinfo,ptVar12);
  local_130 = (CodeLocation *)local_3d8._M_dataplus._M_p;
  local_88.file._M_dataplus._M_p = (pointer)&local_88.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_58._M_dataplus._M_p,
             local_58._M_dataplus._M_p + local_58._M_string_length);
  iVar7 = local_38;
  _Var5._M_p = local_58._M_dataplus._M_p;
  local_88.line = local_38;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog(&local_5c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(_Var5._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,_Var5._M_p,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog(&local_5c);
  }
  iVar7 = local_38;
  _Var5._M_p = local_58._M_dataplus._M_p;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog(&local_5c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x256620);
    }
    else {
      sVar11 = strlen(_Var5._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,_Var5._M_p,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog(&local_5c);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002525f8;
  MakeAndRegisterTestInfo
            (&local_120,(char *)name,(char *)local_130,(char *)0x0,&local_88,
             &TypeIdHelper<(anonymous_namespace)::ARTIteratorTest<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.file._M_dataplus._M_p != &local_88.file.field_2) {
    operator_delete(local_88.file._M_dataplus._M_p,local_88.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if (local_370 != (uint *)&local_360) {
    operator_delete(local_370,local_360 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,CONCAT26(uStack_252,CONCAT24(uStack_254,local_258)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    CONCAT71(local_3b8.field_2._M_allocated_capacity._1_7_,
                             local_3b8.field_2._M_local_buf[0]) + 1);
  }
  uVar4 = local_58.field_2._M_allocated_capacity;
  paVar10 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar10) {
    local_d8.field_2._8_8_ = local_58.field_2._8_8_;
    local_58._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  local_d8.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
  local_d8._M_string_length = local_58._M_string_length;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_b8 = local_38;
  local_d8._M_dataplus._M_p = local_58._M_dataplus._M_p;
  _Var5._M_p = (pointer)paVar10;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_58._M_dataplus._M_p != &local_d8.field_2) &&
     (paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p, local_58._M_dataplus._M_p = (pointer)paVar10,
     operator_delete(paVar19,uVar4 + 1), _Var5._M_p = local_58._M_dataplus._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)local_58._M_dataplus._M_p != paVar10)) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    _Var5._M_p = local_58._M_dataplus._M_p;
  }
  local_58._M_dataplus._M_p = _Var5._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168._M_allocated_capacity + 1);
  }
  paVar10 = &local_1d8;
  if (local_1e8 != paVar10) {
    operator_delete(local_1e8,local_1d8._M_allocated_capacity + 1);
    paVar10 = extraout_RAX;
  }
  return SUB81(paVar10,0);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)]),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>::
        Register(prefix, std::move(code_location), case_name, test_names,
                 index + 1, type_names);
  }